

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

void luaC_step(lua_State *L)

{
  global_State *g;
  lu_mem lVar1;
  long lVar2;
  long lVar3;
  
  g = L->l_G;
  if (g->GCdebt < 1) {
    lVar3 = 0;
  }
  else {
    lVar2 = (ulong)g->GCdebt / 200 + 1;
    lVar3 = g->gcstepmul * lVar2;
    if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)g->gcstepmul),0)
        <= lVar2) {
      lVar3 = 0x7fffffffffffffff;
    }
  }
  if (g->gcrunning == '\0') {
    luaE_setdebt(g,-24000);
    return;
  }
  do {
    lVar1 = singlestep(L);
    lVar3 = lVar3 - lVar1;
    if (lVar3 < -0x95f) {
      if (g->gcstate != '\a') {
        luaE_setdebt(g,(lVar3 / (long)g->gcstepmul) * 200);
        runafewfinalizers(L);
        return;
      }
      break;
    }
  } while (g->gcstate != '\a');
  setpause(g);
  return;
}

Assistant:

void luaC_step (lua_State *L) {
  global_State *g = G(L);
  lua_assert(!g->gcemergency);
  if (g->gcrunning) {  /* running? */
    if(isdecGCmodegen(g))
      genstep(L, g);
    else
      incstep(L, g);
  }
}